

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O2

void alcGetIntegerv(ALCdevice *device,ALCenum param,ALCsizei size,ALCint *values)

{
  span<int,_18446744073709551615UL> values_00;
  DeviceRef dev;
  intrusive_ptr<ALCdevice> local_20;
  
  VerifyDevice((ALCdevice *)0x12a532);
  if (size < 1 || values == (ALCint *)0x0) {
    alcSetError(local_20.mPtr,0xa004);
  }
  else {
    values_00.mDataEnd = values + (uint)size;
    values_00.mData = values;
    GetIntegerv(local_20.mPtr,param,values_00);
  }
  al::intrusive_ptr<ALCdevice>::~intrusive_ptr(&local_20);
  return;
}

Assistant:

ALC_API void ALC_APIENTRY alcGetIntegerv(ALCdevice *device, ALCenum param, ALCsizei size, ALCint *values)
START_API_FUNC
{
    DeviceRef dev{VerifyDevice(device)};
    if(size <= 0 || values == nullptr)
        alcSetError(dev.get(), ALC_INVALID_VALUE);
    else
        GetIntegerv(dev.get(), param, {values, static_cast<ALuint>(size)});
}